

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cc
# Opt level: O3

void __thiscall phosg::Arguments::Arguments(Arguments *this,char **args,size_t num_args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  (this->named)._M_h._M_buckets = &(this->named)._M_h._M_single_bucket;
  (this->named)._M_h._M_bucket_count = 1;
  (this->named)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named)._M_h._M_element_count = 0;
  (this->named)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->positional).
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positional).
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positional).
  super__Vector_base<phosg::Arguments::ArgText,_std::allocator<phosg::Arguments::ArgText>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (num_args != 0) {
    do {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_38,args
                );
      args = args + 1;
      num_args = num_args - 1;
    } while (num_args != 0);
  }
  parse(this,&local_38);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  return;
}

Assistant:

Arguments::Arguments(const char* const* args, size_t num_args) {
  vector<string> tokens;
  for (size_t z = 0; z < num_args; z++) {
    tokens.emplace_back(args[z]);
  }
  this->parse(std::move(tokens));
}